

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * ot::commissioner::CommissionerImpl::EncodePendingOperationalDataset
                  (Error *__return_storage_ptr__,Request *aRequest,
                  PendingOperationalDataset *aDataset)

{
  PendingOperationalDataset *pPVar1;
  bool bVar2;
  Error *pEVar3;
  uint64_t aValue;
  ErrorCode local_fc;
  Tlv local_f8;
  Error local_d8;
  ErrorCode local_ac;
  Tlv local_a8;
  Error local_88;
  ErrorCode local_60 [4];
  Error local_50;
  undefined1 local_21;
  PendingOperationalDataset *local_20;
  PendingOperationalDataset *aDataset_local;
  Request *aRequest_local;
  Error *error;
  
  local_21 = 0;
  local_20 = aDataset;
  aDataset_local = (PendingOperationalDataset *)aRequest;
  aRequest_local = (Request *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  EncodeActiveOperationalDataset
            (&local_50,(Request *)aDataset_local,&local_20->super_ActiveOperationalDataset);
  pEVar3 = Error::operator=(__return_storage_ptr__,&local_50);
  local_60[0] = kNone;
  bVar2 = commissioner::operator!=(pEVar3,local_60);
  Error::~Error(&local_50);
  pPVar1 = aDataset_local;
  if (!bVar2) {
    if (((local_20->super_ActiveOperationalDataset).mPresentFlags & 0x20) != 0) {
      tlv::Tlv::Tlv(&local_a8,kDelayTimer,
                    *(uint32_t *)&(local_20->super_ActiveOperationalDataset).field_0xd4,kMeshCoP);
      AppendTlv(&local_88,(Message *)pPVar1,&local_a8);
      pEVar3 = Error::operator=(__return_storage_ptr__,&local_88);
      local_ac = kNone;
      bVar2 = commissioner::operator!=(pEVar3,&local_ac);
      Error::~Error(&local_88);
      tlv::Tlv::~Tlv(&local_a8);
      if (bVar2) {
        return __return_storage_ptr__;
      }
    }
    pPVar1 = aDataset_local;
    if (((local_20->super_ActiveOperationalDataset).mPresentFlags & 0x10) != 0) {
      aValue = Timestamp::Encode(&local_20->mPendingTimestamp);
      tlv::Tlv::Tlv(&local_f8,kPendingTimestamp,aValue,kMeshCoP);
      AppendTlv(&local_d8,(Message *)pPVar1,&local_f8);
      pEVar3 = Error::operator=(__return_storage_ptr__,&local_d8);
      local_fc = kNone;
      commissioner::operator!=(pEVar3,&local_fc);
      Error::~Error(&local_d8);
      tlv::Tlv::~Tlv(&local_f8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::EncodePendingOperationalDataset(coap::Request                   &aRequest,
                                                        const PendingOperationalDataset &aDataset)
{
    Error error;

    SuccessOrExit(error = EncodeActiveOperationalDataset(aRequest, aDataset));

    if (aDataset.mPresentFlags & PendingOperationalDataset::kDelayTimerBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kDelayTimer, aDataset.mDelayTimer}));
    }

    if (aDataset.mPresentFlags & PendingOperationalDataset::kPendingTimestampBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kPendingTimestamp, aDataset.mPendingTimestamp.Encode()}));
    }

exit:
    return error;
}